

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fct.h
# Opt level: O1

void fctkern__log_suite_start(fctkern_t *nk,fct_ts_t *ts)

{
  size_t sVar1;
  void *pvVar2;
  ulong uVar3;
  
  if (nk == (fctkern_t *)0x0) {
    __assert_fail("nk != __null",
                  "/workspace/llm4binary/github/license_c_cmakelists/imb[P]fctx/include/fct.h",0x915
                  ,"void fctkern__log_suite_start(fctkern_t *, const fct_ts_t *)");
  }
  sVar1 = (nk->logger_list).used_itm_num;
  if (sVar1 != 0) {
    uVar3 = 0;
    do {
      if ((nk->logger_list).used_itm_num <= uVar3) {
        __assert_fail("idx < list->used_itm_num",
                      "/workspace/llm4binary/github/license_c_cmakelists/imb[P]fctx/include/fct.h",
                      0x322,"void *fct_nlist__at(const fct_nlist_t *, size_t)");
      }
      pvVar2 = (nk->logger_list).itm_list[uVar3];
      *(fct_ts_t **)((long)pvVar2 + 0x70) = ts;
      (**(code **)((long)pvVar2 + 0x18))(pvVar2,(long)pvVar2 + 0x58);
      uVar3 = uVar3 + 1;
    } while (sVar1 != uVar3);
  }
  return;
}

Assistant:

static void
fctkern__log_suite_start(fctkern_t *nk, fct_ts_t const *ts)
{
    FCT_ASSERT( nk != NULL );
    FCT_ASSERT( ts != NULL );
    FCT_NLIST_FOREACH_BGN(fct_logger_i*, logger, &(nk->logger_list))
    {
        fct_logger__on_test_suite_start(logger, ts);
    }
    FCT_NLIST_FOREACH_END();
}